

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O3

void Cec_GiaSplitPrintRefs(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  long lVar4;
  
  if (p->pRefs == (int *)0x0) {
    Gia_ManCreateRefs(p);
  }
  pVVar2 = p->vCis;
  uVar3 = (ulong)(uint)pVVar2->nSize;
  if (p->nRegs < pVVar2->nSize) {
    lVar4 = 0;
    do {
      if ((int)uVar3 <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar2->pArray[lVar4];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      printf("%d ",(ulong)(uint)p->pRefs[iVar1]);
      lVar4 = lVar4 + 1;
      pVVar2 = p->vCis;
      uVar3 = (ulong)pVVar2->nSize;
    } while (lVar4 < (long)(uVar3 - (long)p->nRegs));
  }
  putchar(10);
  return;
}

Assistant:

void Cec_GiaSplitPrintRefs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->pRefs == NULL )
        Gia_ManCreateRefs( p ); 
    Gia_ManForEachPi( p, pObj, i )
        printf( "%d ", Gia_ObjRefNum(p, pObj) );
    printf( "\n" );
}